

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MappedExe.cpp
# Opt level: O2

QString * __thiscall
ExeWrappersContainer::getWrapperName
          (QString *__return_storage_ptr__,ExeWrappersContainer *this,size_t id)

{
  iterator iVar1;
  mapped_type *ppEVar2;
  size_t local_20;
  
  local_20 = id;
  iVar1 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_ExeElementWrapper_*>,_std::_Select1st<std::pair<const_unsigned_long,_ExeElementWrapper_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ExeElementWrapper_*>_>_>
          ::find(&(this->wrappers)._M_t,&local_20);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->wrappers)._M_t._M_impl.super__Rb_tree_header) {
    QString::QString(__return_storage_ptr__,"");
  }
  else {
    ppEVar2 = std::
              map<unsigned_long,_ExeElementWrapper_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ExeElementWrapper_*>_>_>
              ::operator[](&this->wrappers,&local_20);
    (*((*ppEVar2)->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

QString ExeWrappersContainer::getWrapperName(size_t id)
{
    if (wrappers.find(id) == wrappers.end()) return "";
    return wrappers[id]->getName();
}